

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O1

void __thiscall VulnerabilityToBin::~VulnerabilityToBin(VulnerabilityToBin *this)

{
  pointer pVVar1;
  
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00109d10;
  fclose((FILE *)this->fileOutBin_);
  if ((this->super_ValidateVulnerability).useIndexFile_ == true) {
    fclose((FILE *)this->fileOutIdx_);
  }
  pVVar1 = (this->vulnerabilityRows_).
           super__Vector_base<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00109d80;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->super_ValidateVulnerability).vulIDToIntBinIDs_._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->super_ValidateVulnerability).intensityBinIDs_._M_t);
  return;
}

Assistant:

VulnerabilityToBin::~VulnerabilityToBin() {

  fclose(fileOutBin_);
  if (useIndexFile_) fclose(fileOutIdx_);

}